

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O3

void duckdb_libpgquery::pg_parser_cleanup(void)

{
  long lVar1;
  void *__ptr;
  ulong uVar2;
  ulong uVar3;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  uVar2 = *(ulong *)(lVar1 + -0x28);
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      __ptr = *(void **)(*(long *)(lVar1 + -0x20) + uVar3 * 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)(*(long *)(lVar1 + -0x20) + uVar3 * 8) = 0;
        uVar2 = *(ulong *)(lVar1 + -0x28);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  free(*(void **)(lVar1 + -0x20));
  return;
}

Assistant:

void pg_parser_cleanup() {
	for (size_t ptr_idx = 0; ptr_idx < pg_parser_state.malloc_ptr_idx; ptr_idx++) {
		char *ptr = pg_parser_state.malloc_ptrs[ptr_idx];
		if (ptr) {
			free(ptr);
			pg_parser_state.malloc_ptrs[ptr_idx] = nullptr;
		}
	}
	free(pg_parser_state.malloc_ptrs);
}